

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O2

bool __thiscall
pybind11::detail::type_caster<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_void>::load
          (type_caster<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_void> *this,handle src,
          bool convert)

{
  bool bVar1;
  int iVar2;
  handle hVar3;
  npy_api *pnVar4;
  undefined7 in_register_00000011;
  Matrix<unsigned_long,_1,_2,_1,_1,_2> *this_00;
  array buf;
  array ref;
  EigenConformable<true> fits;
  array local_78;
  array local_70;
  Matrix<unsigned_long,_1,_2,_1,_1,_2> local_68;
  EigenConformable<true> local_50;
  
  if (((int)CONCAT71(in_register_00000011,convert) == 0) &&
     (bVar1 = array_t<unsigned_long,_16>::check_(src), !bVar1)) {
    return false;
  }
  bVar1 = false;
  array::ensure(&local_70,src,0);
  if (local_70.super_buffer.super_object.super_handle.m_ptr == (object)0x0) goto LAB_001a7473;
  iVar2 = *(int *)((long)local_70.super_buffer.super_object.super_handle.m_ptr + 0x18);
  if (((long)iVar2 - 3U < 0xfffffffffffffffe) ||
     (EigenProps<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>::conformable(&local_50,&local_70),
     local_50.conformable == false)) {
    bVar1 = false;
    goto LAB_001a7473;
  }
  local_68.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.
  array[0] = local_50.rows;
  local_68.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.
  array[1] = local_50.cols;
  Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>::operator=(&this->value,&local_68);
  local_78.super_buffer.super_object.super_handle.m_ptr = (buffer)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  hVar3 = eigen_ref_array<pybind11::detail::EigenProps<Eigen::Matrix<unsigned_long,1,2,1,1,2>>,Eigen::Matrix<unsigned_long,1,2,1,1,2>>
                    (&this->value,(PyObject *)&_Py_NoneStruct);
  local_68.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.m_storage.m_data.
  array[0] = (unsigned_long)hVar3;
  pybind11::object::~object((object *)&local_78);
  if (iVar2 == 1) {
    array::squeeze(&local_78);
    this_00 = &local_68;
LAB_001a7437:
    pybind11::object::operator=((object *)this_00,(object *)&local_78);
    pybind11::object::~object((object *)&local_78);
  }
  else if (*(int *)&hVar3.m_ptr[1].ob_type == 1) {
    array::squeeze(&local_78);
    this_00 = (Matrix<unsigned_long,_1,_2,_1,_1,_2> *)&local_70;
    goto LAB_001a7437;
  }
  pnVar4 = npy_api::get();
  iVar2 = (*pnVar4->PyArray_CopyInto_)
                    ((PyObject *)
                     local_68.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>.
                     m_storage.m_data.array[0],
                     (PyObject *)local_70.super_buffer.super_object.super_handle.m_ptr);
  bVar1 = -1 < iVar2;
  if (!bVar1) {
    PyErr_Clear();
  }
  pybind11::object::~object((object *)&local_68);
LAB_001a7473:
  pybind11::object::~object((object *)&local_70);
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        // If we're in no-convert mode, only load if given an array of the correct type
        if (!convert && !isinstance<array_t<Scalar>>(src))
            return false;

        // Coerce into an array, but don't do type conversion yet; the copy below handles it.
        auto buf = array::ensure(src);

        if (!buf)
            return false;

        auto dims = buf.ndim();
        if (dims < 1 || dims > 2)
            return false;

        auto fits = props::conformable(buf);
        if (!fits)
            return false;

        // Allocate the new type, then build a numpy reference into it
        value = Type(fits.rows, fits.cols);
        auto ref = reinterpret_steal<array>(eigen_ref_array<props>(value));
        if (dims == 1) ref = ref.squeeze();
        else if (ref.ndim() == 1) buf = buf.squeeze();

        int result = detail::npy_api::get().PyArray_CopyInto_(ref.ptr(), buf.ptr());

        if (result < 0) { // Copy failed!
            PyErr_Clear();
            return false;
        }

        return true;
    }